

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_setParams(ZSTD_CCtx *cctx,ZSTD_parameters params)

{
  ZSTD_compressionParameters cParams;
  ZSTD_parameters ZVar1;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  ZSTD_strategy ZVar3;
  undefined4 uStack_44;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  ZSTD_CCtx *cctx_local;
  
  ZVar1 = params;
  ZVar3 = (ZSTD_strategy)&params;
  uStack_44 = (undefined4)((ulong)&params >> 0x20);
  cParams.targetLength = in_stack_ffffffffffffffb4;
  cParams.windowLog = params.cParams.hashLog;
  cParams.chainLog = params.cParams.searchLog;
  cParams.hashLog = params.cParams.minMatch;
  cParams.searchLog = params.cParams.targetLength;
  cParams.minMatch = params.cParams.strategy;
  cParams.strategy = ZVar3;
  params = ZVar1;
  cctx_local = (ZSTD_CCtx *)ZSTD_checkCParams(cParams);
  uVar2 = ERR_isError((size_t)cctx_local);
  if (uVar2 == 0) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_CCtx_setFParams
                           (cctx,*(ZSTD_frameParameters *)(CONCAT44(uStack_44,ZVar3) + 0x1c));
    uVar2 = ERR_isError((size_t)cctx_local);
    if (uVar2 == 0) {
      cctx_local = (ZSTD_CCtx *)
                   ZSTD_CCtx_setCParams
                             (cctx,*(ZSTD_compressionParameters *)CONCAT44(uStack_44,ZVar3));
      uVar2 = ERR_isError((size_t)cctx_local);
      if (uVar2 == 0) {
        cctx_local = (ZSTD_CCtx *)0x0;
      }
    }
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_CCtx_setParams(ZSTD_CCtx* cctx, ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParams");
    /* First check cParams, because we want to update all or none. */
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    /* Next set fParams, because this could fail if the cctx isn't in init stage. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setFParams(cctx, params.fParams), "");
    /* Finally set cParams, which should succeed. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setCParams(cctx, params.cParams), "");
    return 0;
}